

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::TemplatedIndexOfHelper<false,Js::RecyclableObject,unsigned_int>
              (RecyclableObject *pArr,Var search,uint fromIndex,uint toIndex,
              ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  uint64 uVar5;
  uint64 uVar6;
  Var pvVar7;
  ulong uVar8;
  Var local_40;
  Var element;
  
  local_40 = (Var)0x0;
  element = (Var)((ulong)search & 0xffff000000000000);
  if (((ulong)search & 0x1ffff00000000) != 0x1000000000000 &&
      (undefined1 *)element == &DAT_1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
LAB_00bb42b2:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (fromIndex < toIndex) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    pvVar7 = (Var)((ulong)fromIndex + 0x1000000000000);
    do {
      BVar3 = TemplatedGetItem<Js::RecyclableObject>
                        (pArr,(uint32)pvVar7,&local_40,scriptContext,true);
      if (BVar3 != 0) {
        if ((undefined1 *)element == &DAT_1000000000000) {
          uVar8 = (ulong)local_40 & 0xffff000000000000;
          if (((ulong)local_40 & 0x1ffff00000000) != 0x1000000000000 && uVar8 == 0x1000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar4 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar2) goto LAB_00bb42b2;
            *puVar4 = 0;
          }
          if (uVar8 != 0x1000000000000) goto LAB_00bb41b1;
          if (local_40 != search) goto LAB_00bb41c4;
        }
        else {
LAB_00bb41b1:
          BVar3 = JavascriptOperators::StrictEqual(local_40,search,scriptContext);
          if (BVar3 == 0) goto LAB_00bb41c4;
        }
        if (-1 < (int)(uint32)pvVar7) {
          return pvVar7;
        }
        element = (Var)(double)((ulong)pvVar7 & 0xffffffff);
        uVar5 = NumberUtilities::ToSpecial((double)element);
        bVar2 = NumberUtilities::IsNan((double)element);
        if (((bVar2) &&
            (uVar6 = NumberUtilities::ToSpecial((double)element), uVar6 != 0xfff8000000000000)) &&
           (uVar6 = NumberUtilities::ToSpecial((double)element), uVar6 != 0x7ff8000000000000)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar2) goto LAB_00bb42b2;
          *puVar4 = 0;
        }
        return (Var)(uVar5 ^ 0xfffc000000000000);
      }
LAB_00bb41c4:
      pvVar7 = (Var)((long)pvVar7 + 1);
    } while (toIndex != (uint)pvVar7);
  }
  return &DAT_10000ffffffff;
}

Assistant:

Var JavascriptArray::TemplatedIndexOfHelper(T * pArr, Var search, P fromIndex, P toIndex, ScriptContext * scriptContext)
    {
        Var element = nullptr;
        bool isSearchTaggedInt = TaggedInt::Is(search);
        bool doUndefinedSearch = includesAlgorithm && JavascriptOperators::GetTypeId(search) == TypeIds_Undefined;

        Var trueValue = scriptContext->GetLibrary()->GetTrue();
        Var falseValue = scriptContext->GetLibrary()->GetFalse();

        //Consider: enumerating instead of walking all indices
        for (P i = fromIndex; i < toIndex; i++)
        {
            if (!TryTemplatedGetItem<T>(pArr, i, &element, scriptContext, !includesAlgorithm))
            {
                if (doUndefinedSearch)
                {
                    return trueValue;
                }
                continue;
            }

            if (isSearchTaggedInt && TaggedInt::Is(element))
            {
                if (element == search)
                {
                    return includesAlgorithm? trueValue : JavascriptNumber::ToVar(i, scriptContext);
                }
                continue;
            }

            if (includesAlgorithm)
            {
                //Array.prototype.includes
                if (JavascriptConversion::SameValueZero(element, search))
                {
                    return trueValue;
                }
            }
            else
            {
                //Array.prototype.indexOf
                if (JavascriptOperators::StrictEqual(element, search, scriptContext))
                {
                    return JavascriptNumber::ToVar(i, scriptContext);
                }
            }
        }

        return includesAlgorithm ? falseValue :  TaggedInt::ToVarUnchecked(-1);
    }